

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O1

int os_system_linux_netlink_add_mc(os_system_netlink *nl,uint32_t *groups,size_t groupcount)

{
  int iVar1;
  ulong uVar2;
  
  if (groupcount != 0) {
    do {
      iVar1 = setsockopt((nl->socket).fd.fd,0x10e,1,groups,4);
      if (iVar1 != 0) {
        uVar2 = (ulong)nl->used_by->logging;
        if (((&log_global_mask)[uVar2] & 4) == 0) {
          return -1;
        }
        oonf_log(4,uVar2,"src/base/os_linux/os_system_linux.c",0x193,0,0,
                 "Could not join netlink \'%s\' mc group: %x",nl->name,*groups);
        return -1;
      }
      groups = groups + 1;
      groupcount = groupcount - 1;
    } while (groupcount != 0);
  }
  return 0;
}

Assistant:

int
os_system_linux_netlink_add_mc(struct os_system_netlink *nl, const uint32_t *groups, size_t groupcount) {
  size_t i;

  for (i = 0; i < groupcount; i++) {
    if (setsockopt(os_fd_get_fd(&nl->socket.fd), SOL_NETLINK, NETLINK_ADD_MEMBERSHIP, &groups[i], sizeof(groups[i]))) {
      OONF_WARN(nl->used_by->logging, "Could not join netlink '%s' mc group: %x", nl->name, groups[i]);
      return -1;
    }
  }
  return 0;
}